

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

bool sentencepiece::string_util::lexical_cast<long>(string_view arg,long *result)

{
  bool bVar1;
  const_pointer pvVar2;
  ostream *poVar3;
  long *plVar4;
  long *in_RDX;
  stringstream ss;
  bool local_1c2;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  long *local_18;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  local_18 = in_RDX;
  std::__cxx11::stringstream::stringstream(local_1a0);
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_10);
  poVar3 = std::operator<<(local_190,pvVar2);
  bVar1 = std::ios::operator_cast_to_bool((ios *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18)));
  local_1c2 = false;
  if (bVar1) {
    plVar4 = (long *)std::istream::operator>>(local_1a0,local_18);
    local_1c2 = std::ios::operator_cast_to_bool((ios *)((long)plVar4 + *(long *)(*plVar4 + -0x18)));
  }
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return local_1c2;
}

Assistant:

inline bool lexical_cast(absl::string_view arg, Target *result) {
  std::stringstream ss;
  return (ss << arg.data() && ss >> *result);
}